

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O3

void statistics(string *clusters_path)

{
  unsigned_long uVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint16_t length;
  vector<unsigned_long,_std::allocator<unsigned_long>_> clust_len_freq;
  uint64_t start;
  ifstream clusters;
  ushort local_272;
  ulong local_270;
  ulong local_268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_260;
  long local_248;
  value_type_conflict local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((string *)local_238);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)clusters_path);
  local_268 = (ulong)max_clust_length;
  local_240 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_260,local_268 + 1,&local_240,(allocator_type *)&local_272);
  local_270 = 1;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
    local_270 = 0;
    do {
      std::istream::read((char *)local_238,(long)&local_240);
      std::istream::read((char *)local_238,(long)&local_272);
      uVar4 = (ulong)local_272;
      if ((uVar4 <= local_268) &&
         (local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] =
               local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4] + 1, local_270 <= uVar4)) {
        local_270 = uVar4;
      }
      n_clust = n_clust + 1;
      n_bases = n_bases + uVar4;
    } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
    local_270 = local_270 + 1;
  }
  if ((int)local_268 == 0) {
    uVar4 = 0;
  }
  else {
    uVar3 = 1;
    uVar6 = 0;
    do {
      uVar4 = local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3] * uVar3;
      if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
        uVar4 = uVar6;
      }
      uVar3 = uVar3 + 1;
      uVar6 = uVar4;
    } while ((int)local_268 + 1 != uVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nDistribution of base coverage: ",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\ncluster length\t# bases in a cluster with this length\t cumulative fraction (from 2m = "
             ,0x56);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,mcov_out * 2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar5 = 0;
  local_248 = 0;
  do {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    std::ostream::flush();
    if (uVar4 <= local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar5] * lVar5 * 100) {
      uVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-",1);
        std::ostream::flush();
        uVar6 = uVar6 + 1;
      } while (uVar6 < (local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar5] * lVar5 * 100) / uVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ostream::flush();
    if (SBORROW8(lVar5,(long)mcov_out * 2) == lVar5 + (long)mcov_out * -2 < 0) {
      uVar1 = local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      local_248 = local_248 + uVar1 * lVar5;
      auVar8._8_4_ = (int)((ulong)local_248 >> 0x20);
      auVar8._0_8_ = local_248;
      auVar8._12_4_ = 0x45300000;
      auVar9._8_4_ = (int)(n_bases >> 0x20);
      auVar9._0_8_ = n_bases;
      auVar9._12_4_ = 0x45300000;
      std::ostream::_M_insert<double>
                (((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_248) - 4503599627370496.0)) /
                 ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)n_bases) - 4503599627370496.0)));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    lVar5 = lVar5 + 1;
  } while (lVar5 != local_270);
  uVar6 = (long)mcov_out * 2;
  max_clust_length = (int)uVar6;
  lVar5 = local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[(long)mcov_out * 2] * uVar6;
  dVar7 = 1.0 / (((double)CONCAT44(0x45300000,(int)(n_bases >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)n_bases) - 4503599627370496.0));
  auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar10._0_8_ = lVar5;
  auVar10._12_4_ = 0x45300000;
  uVar4 = uVar6;
  if ((uint)max_clust_length < (uint)local_268 &&
      ((auVar10._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * dVar7 < pval) {
    do {
      uVar4 = uVar4 + 1;
      lVar5 = local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4] * uVar4 + lVar5;
      auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = 0x45300000;
      max_clust_length = (int)uVar6 + 1;
      uVar6 = (ulong)(uint)max_clust_length;
      if (pval <= ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * dVar7) break;
    } while ((uint)max_clust_length < (uint)local_268);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nCluster sizes allowed: [",0x19);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,mcov_out * 2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,max_clust_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ifstream::close();
  if (local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void statistics(string & clusters_path){

	ifstream clusters;
	clusters.open(clusters_path, ios::in | ios::binary);

	uint64_t MAX_C_LEN = max_clust_length;

	//init with max cluster length 200
	auto clust_len_freq = vector<uint64_t>(MAX_C_LEN+1,0);

	uint64_t max_len = 0;

	while(not clusters.eof()){

		//read entry in clusters

		uint64_t start;
		uint16_t length;

		clusters.read((char*)&start, sizeof(uint64_t));
		clusters.read((char*)&length, sizeof(uint16_t));

		if(length <= MAX_C_LEN){

			clust_len_freq[length]++;
			max_len = length>max_len ? length : max_len;

		}

		n_clust++;
		n_bases+=length;

	}

	uint64_t max = 0;
	for(int i=1;i<=MAX_C_LEN;++i) max = clust_len_freq[i]*i > max ? clust_len_freq[i]*i : max;

	uint64_t cumulative = 0;

	cout << "\nDistribution of base coverage: "<< endl;
	cout << "\ncluster length\t# bases in a cluster with this length\t cumulative fraction (from 2m = " << 2*mcov_out << ")" << endl;
	for(int i=0;i<=max_len;++i){

		cout << i << "\t" << flush;
		for(uint64_t j=0;j<(100*clust_len_freq[i]*i)/max;++j) cout << "-" << flush;
		cout << "\t" << clust_len_freq[i]*i << flush;

		if(i>=2*mcov_out){

			cumulative += clust_len_freq[i]*i;
			cout << "\t" << double(cumulative)/double(n_bases);

		}

		cout << endl;


	}

	//auto-detect max cluster length

	max_clust_length = 2*mcov_out;//start from the minimum cluster length
	cumulative = clust_len_freq[max_clust_length]*max_clust_length;//cumulative number of bases

	while( double(cumulative)/double(n_bases) < pval and  max_clust_length < MAX_C_LEN){

		max_clust_length++;
		cumulative += clust_len_freq[max_clust_length]*max_clust_length;

	}

/*	max = 0;
	for(int i=1;i<=MAX_C_LEN;++i) max = clust_len_freq[i] > max ? clust_len_freq[i] : max;

	cout << "\nDistribution of cluster length: "<< endl;
	cout << "\ncluster length\t# clusters with this length" << endl;
	for(int i=0;i<=max_len;++i){

		cout << i << "\t" << flush;
		for(uint64_t j=0;j<(100*clust_len_freq[i])/max;++j) cout << "-" << flush;
		cout << "   " << clust_len_freq[i] << endl;


	}*/

	cout << "\nCluster sizes allowed: [" << mcov_out*2 << "," << max_clust_length << "]" << endl;

	clusters.close();

}